

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O1

void Test_EmailLogging_InvalidAddress::RunTest(void)

{
  bool bVar1;
  undefined8 extraout_RAX;
  FlagSaver saver;
  undefined1 local_38 [16];
  _Alloc_hider local_28;
  char local_18 [16];
  
  local_38._0_4_ = fLI::FLAGS_v;
  local_38._4_4_ = fLI::FLAGS_stderrthreshold;
  local_38[8] = (bool)fLB::FLAGS_logtostderr;
  local_38[9] = (bool)fLB::FLAGS_alsologtostderr;
  local_28._M_p = local_18;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_28,fLS::FLAGS_logmailer_buf_abi_cxx11_,
             DAT_00143018 + fLS::FLAGS_logmailer_buf_abi_cxx11_);
  std::__cxx11::string::_M_replace
            ((ulong)&fLS::FLAGS_logmailer_buf_abi_cxx11_,0,DAT_00143018,0x12ff5d);
  bVar1 = google::SendEmail("hello world@foo","Example subject","Example body");
  if (!bVar1) {
    google::FlagSaver::~FlagSaver((FlagSaver *)local_38);
    return;
  }
  RunTest();
  google::FlagSaver::~FlagSaver((FlagSaver *)local_38);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void TestLogString() {
  vector<string> errors;
  vector<string>* no_errors = nullptr;

  LOG_STRING(INFO, &errors) << "LOG_STRING: "
                            << "collected info";
  LOG_STRING(WARNING, &errors) << "LOG_STRING: "
                               << "collected warning";
  LOG_STRING(ERROR, &errors) << "LOG_STRING: "
                             << "collected error";

  LOG_STRING(INFO, no_errors) << "LOG_STRING: "
                              << "reported info";
  LOG_STRING(WARNING, no_errors) << "LOG_STRING: "
                                 << "reported warning";
  LOG_STRING(ERROR, nullptr) << "LOG_STRING: "
                             << "reported error";

  for (auto& error : errors) {
    LOG(INFO) << "Captured by LOG_STRING:  " << error;
  }
}